

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O2

int32 ngram_add_word_internal(ngram_model_t *model,char *word,int32 classid)

{
  uint uVar1;
  int iVar2;
  int32 iVar3;
  char **ppcVar4;
  char *pcVar5;
  void *pvVar6;
  uint local_1c;
  
  iVar3 = hash_table_lookup_int32(model->wid,word,(int32 *)&local_1c);
  if (iVar3 == 0) {
    err_msg(ERR_WARN,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
            ,0x268,"Omit duplicate word \'%s\'\n",word);
  }
  else {
    uVar1 = model->n_words;
    local_1c = classid << 0x18 | uVar1 | 0x80000000;
    if (classid < 0) {
      local_1c = uVar1;
    }
    iVar2 = model->n_1g_alloc;
    if (iVar2 <= (int)uVar1) {
      model->n_1g_alloc = iVar2 + 10;
      ppcVar4 = (char **)__ckd_realloc__(model->word_str,(long)iVar2 * 8 + 0x50,
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                                         ,0x277);
      model->word_str = ppcVar4;
    }
    pcVar5 = __ckd_salloc__(word,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x27b);
    iVar2 = model->n_words;
    model->word_str[iVar2] = pcVar5;
    pvVar6 = hash_table_enter(model->wid,model->word_str[iVar2],(void *)(long)(int)local_1c);
    if (local_1c != (uint)pvVar6) {
      err_msg(ERR_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
              ,0x281,"Hash insertion failed for word %s => %p (should not happen)\n",
              model->word_str[model->n_words]);
    }
    model->n_words = model->n_words + 1;
  }
  return local_1c;
}

Assistant:

int32
ngram_add_word_internal(ngram_model_t * model,
                        const char *word, int32 classid)
{

    /* Check for hash collisions. */
    int32 wid;
    if (hash_table_lookup_int32(model->wid, word, &wid) == 0) {
        E_WARN("Omit duplicate word '%s'\n", word);
        return wid;
    }

    /* Take the next available word ID */
    wid = model->n_words;
    if (classid >= 0) {
        wid = NGRAM_CLASSWID(wid, classid);
    }

    /* Reallocate word_str if necessary. */
    if (model->n_words >= model->n_1g_alloc) {
        model->n_1g_alloc += UG_ALLOC_STEP;
        model->word_str = ckd_realloc(model->word_str,
                                      sizeof(*model->word_str) *
                                      model->n_1g_alloc);
    }
    /* Add the word string in the appropriate manner. */
    /* Class words are always dynamically allocated. */
    model->word_str[model->n_words] = ckd_salloc(word);
    /* Now enter it into the hash table. */
    if (hash_table_enter_int32
        (model->wid, model->word_str[model->n_words], wid) != wid) {
        E_ERROR
            ("Hash insertion failed for word %s => %p (should not happen)\n",
             model->word_str[model->n_words], (void *) (size_t) (wid));
    }
    /* Increment number of words. */
    ++model->n_words;
    return wid;
}